

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearUpdateVecs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  cpp_dec_float<200U,_int,_void> *pcVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  this_00 = in_RDI;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clearUpdate(in_RDI);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clearUpdate(this_00);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clearUpdate(this_00);
  pcVar1 = &in_RDI[0xb].theval.m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &in_RDI[0xb].theval.m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  pcVar1 = &in_RDI[0xb].theval.m_backend;
  (pcVar1->data)._M_elems[10] = 0;
  (pcVar1->data)._M_elems[0xb] = 0;
  pcVar1 = &in_RDI[0xb].theval.m_backend;
  (pcVar1->data)._M_elems[0xe] = 0;
  (pcVar1->data)._M_elems[0xf] = 0;
  return;
}

Assistant:

void SPxSolverBase<R>::clearUpdateVecs(void)
   {
      theFvec->clearUpdate();
      thePvec->clearUpdate();
      theCoPvec->clearUpdate();
      solveVector2 = nullptr;
      solveVector3 = nullptr;
      coSolveVector2 = nullptr;
      coSolveVector3 = nullptr;
   }